

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O1

idx_t __thiscall duckdb::RadixHTConfig::MaximumSinkRadixBits(RadixHTConfig *this)

{
  idx_t iVar1;
  
  if (2 < this->number_of_threads) {
    iVar1 = 6;
    if (this->row_width < 0x40) {
      iVar1 = (ulong)(this->row_width < 0x20) + 7;
    }
    return iVar1;
  }
  iVar1 = InitialSinkRadixBits(this);
  return iVar1;
}

Assistant:

idx_t RadixHTConfig::MaximumSinkRadixBits() const {
	if (number_of_threads <= GROW_STRATEGY_THREAD_THRESHOLD) {
		return InitialSinkRadixBits(); // Don't repartition unless we go external
	}
	// If rows are very wide we have to reduce the number of partitions, otherwise cache misses get out of hand
	if (row_width >= ROW_WIDTH_THRESHOLD_TWO) {
		return MAXIMUM_FINAL_SINK_RADIX_BITS - 2;
	}
	if (row_width >= ROW_WIDTH_THRESHOLD_ONE) {
		return MAXIMUM_FINAL_SINK_RADIX_BITS - 1;
	}
	return MAXIMUM_FINAL_SINK_RADIX_BITS;
}